

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall t_cpp_generator::init_generator(t_cpp_generator *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  ostream *poVar5;
  vector<t_program_*,_std::allocator<t_program_*>_> *this_00;
  reference pptVar6;
  string *psVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  t_program *ptVar8;
  int __oflag;
  int __oflag_00;
  int __oflag_01;
  allocator local_451;
  string local_450;
  string local_430;
  string local_410;
  allocator local_3e9;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  reference local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *cpp_include;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *cpp_includes;
  string local_300;
  t_program *local_2e0;
  t_program *include;
  const_iterator __end1;
  const_iterator __begin1;
  vector<t_program_*,_std::allocator<t_program_*>_> *__range1;
  vector<t_program_*,_std::allocator<t_program_*>_> *includes;
  string local_298 [32];
  string local_278 [39];
  allocator local_251;
  string local_250 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  undefined1 local_1f0 [8];
  string f_types_tcc_name;
  string local_1c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [8];
  string f_types_impl_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [8];
  string f_types_name;
  string local_c8;
  undefined1 local_a6;
  allocator local_a5 [13];
  undefined1 local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38 [36];
  int local_14;
  t_cpp_generator *ptStack_10;
  int r;
  t_cpp_generator *this_local;
  
  ptStack_10 = this;
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(local_38);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar2 = mkdir(pcVar3,0x1ff);
  std::__cxx11::string::~string(local_38);
  local_14 = iVar2;
  if (iVar2 == -1) {
    piVar4 = __errno_location();
    if (*piVar4 != 0x11) {
      local_a6 = 1;
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(local_98);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_78,pcVar3,local_a5);
      std::operator+(&local_58,&local_78,": ");
      piVar4 = __errno_location();
      pcVar3 = strerror(*piVar4);
      std::operator+(__return_storage_ptr__,&local_58,pcVar3);
      local_a6 = 0;
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  std::__cxx11::string::string
            ((string *)(f_types_name.field_2._M_local_buf + 8),
             (string *)&(this->super_t_oop_generator).super_t_generator.program_name_);
  get_legal_program_name(&local_c8,this,(string *)(f_types_name.field_2._M_local_buf + 8));
  psVar7 = &(this->super_t_oop_generator).super_t_generator.program_name_;
  std::__cxx11::string::operator=((string *)psVar7,(string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)(f_types_name.field_2._M_local_buf + 8));
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])();
  std::operator+(&local_128,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&f_types_impl_name.field_2 + 8),psVar7);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                 &local_128,"_types.h");
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)(f_types_impl_name.field_2._M_local_buf + 8));
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&this->f_types_,local_108,__oflag);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_1a8);
  std::operator+(&local_188,&local_1a8,
                 &(this->super_t_oop_generator).super_t_generator.program_name_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                 &local_188,"_types.cpp");
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1c8,pcVar3,(allocator *)(f_types_tcc_name.field_2._M_local_buf + 0xf));
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&this->f_types_impl_,(char *)local_1c8,__oflag_00);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)(f_types_tcc_name.field_2._M_local_buf + 0xf))
  ;
  if ((this->gen_templates_ & 1U) != 0) {
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_230);
    std::operator+(&local_210,&local_230,
                   &(this->super_t_oop_generator).super_t_generator.program_name_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                   &local_210,"_types.tcc");
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_250,pcVar3,&local_251);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
              (&this->f_types_tcc_,(char *)local_250,__oflag_01);
    std::__cxx11::string::~string(local_250);
    std::allocator<char>::~allocator((allocator<char> *)&local_251);
    std::__cxx11::string::~string((string *)local_1f0);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(local_278);
  std::operator<<((ostream *)&this->f_types_,local_278);
  std::__cxx11::string::~string(local_278);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(local_298);
  std::operator<<((ostream *)&this->f_types_impl_,local_298);
  std::__cxx11::string::~string(local_298);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&includes);
  std::operator<<((ostream *)&this->f_types_tcc_,(string *)&includes);
  std::__cxx11::string::~string((string *)&includes);
  poVar5 = std::operator<<((ostream *)&this->f_types_,"#ifndef ");
  poVar5 = std::operator<<(poVar5,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.program_name_);
  poVar5 = std::operator<<(poVar5,"_TYPES_H");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#define ");
  poVar5 = std::operator<<(poVar5,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.program_name_);
  poVar5 = std::operator<<(poVar5,"_TYPES_H");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<((ostream *)&this->f_types_tcc_,"#ifndef ");
  poVar5 = std::operator<<(poVar5,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.program_name_);
  poVar5 = std::operator<<(poVar5,"_TYPES_TCC");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#define ");
  poVar5 = std::operator<<(poVar5,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.program_name_);
  poVar5 = std::operator<<(poVar5,"_TYPES_TCC");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<((ostream *)&this->f_types_,"#include <iosfwd>");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#include <thrift/Thrift.h>");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#include <thrift/TApplicationException.h>");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#include <thrift/TBase.h>");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#include <thrift/protocol/TProtocol.h>");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#include <thrift/transport/TTransport.h>");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<((ostream *)&this->f_types_,"#include <functional>");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<((ostream *)&this->f_types_,"#include <memory>");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  this_00 = t_program::get_includes((this->super_t_oop_generator).super_t_generator.program_);
  __end1 = std::vector<t_program_*,_std::allocator<t_program_*>_>::begin(this_00);
  include = (t_program *)std::vector<t_program_*,_std::allocator<t_program_*>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
                                *)&include);
    if (!bVar1) break;
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
              ::operator*(&__end1);
    local_2e0 = *pptVar6;
    poVar5 = std::operator<<((ostream *)&this->f_types_,"#include \"");
    get_include_prefix_abi_cxx11_(&local_300,this,local_2e0);
    poVar5 = std::operator<<(poVar5,(string *)&local_300);
    psVar7 = t_program::get_name_abi_cxx11_(local_2e0);
    poVar5 = std::operator<<(poVar5,(string *)psVar7);
    poVar5 = std::operator<<(poVar5,"_types.h\"");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_300);
    poVar5 = std::operator<<((ostream *)&this->f_types_tcc_,"#include \"");
    get_include_prefix_abi_cxx11_((string *)&cpp_includes,this,local_2e0);
    poVar5 = std::operator<<(poVar5,(string *)&cpp_includes);
    psVar7 = t_program::get_name_abi_cxx11_(local_2e0);
    poVar5 = std::operator<<(poVar5,(string *)psVar7);
    poVar5 = std::operator<<(poVar5,"_types.tcc\"");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&cpp_includes);
    __gnu_cxx::
    __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>::
    operator++(&__end1);
  }
  std::operator<<((ostream *)&this->f_types_,(string *)&::endl_abi_cxx11_);
  this_01 = t_program::get_cpp_includes_abi_cxx11_
                      ((this->super_t_oop_generator).super_t_generator.program_);
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_01);
  cpp_include = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&cpp_include);
    if (!bVar1) break;
    local_348 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1_1);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_348);
    if (*pcVar3 == '<') {
      poVar5 = std::operator<<((ostream *)&this->f_types_,"#include ");
      poVar5 = std::operator<<(poVar5,(string *)local_348);
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    }
    else {
      poVar5 = std::operator<<((ostream *)&this->f_types_,"#include \"");
      poVar5 = std::operator<<(poVar5,(string *)local_348);
      poVar5 = std::operator<<(poVar5,"\"");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  std::operator<<((ostream *)&this->f_types_,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<((ostream *)&this->f_types_impl_,"#include \"");
  ptVar8 = t_generator::get_program((t_generator *)this);
  get_include_prefix_abi_cxx11_(&local_368,this,ptVar8);
  poVar5 = std::operator<<(poVar5,(string *)&local_368);
  poVar5 = std::operator<<(poVar5,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.program_name_);
  poVar5 = std::operator<<(poVar5,"_types.h\"");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_368);
  poVar5 = std::operator<<((ostream *)&this->f_types_tcc_,"#include \"");
  ptVar8 = t_generator::get_program((t_generator *)this);
  get_include_prefix_abi_cxx11_(&local_388,this,ptVar8);
  poVar5 = std::operator<<(poVar5,(string *)&local_388);
  poVar5 = std::operator<<(poVar5,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.program_name_);
  poVar5 = std::operator<<(poVar5,"_types.h\"");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_388);
  poVar5 = std::operator<<((ostream *)&this->f_types_impl_,"#include <algorithm>");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<((ostream *)&this->f_types_impl_,"#include <ostream>");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<((ostream *)&this->f_types_impl_,"#include <thrift/TToString.h>");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  ptVar8 = (this->super_t_oop_generator).super_t_generator.program_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3e8,"cpp",&local_3e9);
  t_program::get_namespace(&local_3c8,ptVar8,&local_3e8);
  namespace_open(&local_3a8,this,&local_3c8);
  std::__cxx11::string::operator=((string *)&this->ns_open_,(string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  ptVar8 = (this->super_t_oop_generator).super_t_generator.program_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_450,"cpp",&local_451);
  t_program::get_namespace(&local_430,ptVar8,&local_450);
  namespace_close(&local_410,this,&local_430);
  std::__cxx11::string::operator=((string *)&this->ns_close_,(string *)&local_410);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&this->ns_open_);
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<((ostream *)&this->f_types_impl_,(string *)&this->ns_open_);
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<((ostream *)&this->f_types_tcc_,(string *)&this->ns_open_);
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_168);
  std::__cxx11::string::~string((string *)local_108);
  return;
}

Assistant:

void t_cpp_generator::init_generator() {
  // Make output directory
  MKDIR(get_out_dir().c_str());

  program_name_ = get_legal_program_name(program_name_);

  // Make output file
  string f_types_name = get_out_dir() + program_name_ + "_types.h";
  f_types_.open(f_types_name);

  string f_types_impl_name = get_out_dir() + program_name_ + "_types.cpp";
  f_types_impl_.open(f_types_impl_name.c_str());

  if (gen_templates_) {
    // If we don't open the stream, it appears to just discard data,
    // which is fine.
    string f_types_tcc_name = get_out_dir() + program_name_ + "_types.tcc";
    f_types_tcc_.open(f_types_tcc_name.c_str());
  }

  // Print header
  f_types_ << autogen_comment();
  f_types_impl_ << autogen_comment();
  f_types_tcc_ << autogen_comment();

  // Start ifndef
  f_types_ << "#ifndef " << program_name_ << "_TYPES_H" << endl << "#define " << program_name_
           << "_TYPES_H" << endl << endl;
  f_types_tcc_ << "#ifndef " << program_name_ << "_TYPES_TCC" << endl << "#define " << program_name_
               << "_TYPES_TCC" << endl << endl;

  // Include base types
  f_types_ << "#include <iosfwd>" << endl
           << endl
           << "#include <thrift/Thrift.h>" << endl
           << "#include <thrift/TApplicationException.h>" << endl
           << "#include <thrift/TBase.h>" << endl
           << "#include <thrift/protocol/TProtocol.h>" << endl
           << "#include <thrift/transport/TTransport.h>" << endl
           << endl;
  // Include C++xx compatibility header
  f_types_ << "#include <functional>" << endl;
  f_types_ << "#include <memory>" << endl;

  // Include other Thrift includes
  const vector<t_program*>& includes = program_->get_includes();
  for (auto include : includes) {
    f_types_ << "#include \"" << get_include_prefix(*include) << include->get_name()
             << "_types.h\"" << endl;

    // XXX(simpkins): If gen_templates_ is enabled, we currently assume all
    // included files were also generated with templates enabled.
    f_types_tcc_ << "#include \"" << get_include_prefix(*include) << include->get_name()
                 << "_types.tcc\"" << endl;
  }
  f_types_ << endl;

  // Include custom headers
  const vector<string>& cpp_includes = program_->get_cpp_includes();
  for (const auto & cpp_include : cpp_includes) {
    if (cpp_include[0] == '<') {
      f_types_ << "#include " << cpp_include << endl;
    } else {
      f_types_ << "#include \"" << cpp_include << "\"" << endl;
    }
  }
  f_types_ << endl;

  // Include the types file
  f_types_impl_ << "#include \"" << get_include_prefix(*get_program()) << program_name_
                << "_types.h\"" << endl << endl;
  f_types_tcc_ << "#include \"" << get_include_prefix(*get_program()) << program_name_
               << "_types.h\"" << endl << endl;

  // The swap() code needs <algorithm> for std::swap()
  f_types_impl_ << "#include <algorithm>" << endl;
  // for operator<<
  f_types_impl_ << "#include <ostream>" << endl << endl;
  f_types_impl_ << "#include <thrift/TToString.h>" << endl << endl;

  // Open namespace
  ns_open_ = namespace_open(program_->get_namespace("cpp"));
  ns_close_ = namespace_close(program_->get_namespace("cpp"));

  f_types_ << ns_open_ << endl << endl;

  f_types_impl_ << ns_open_ << endl << endl;

  f_types_tcc_ << ns_open_ << endl << endl;
}